

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

ByteData *
cfd::core::BitsToBytes(ByteData *__return_storage_ptr__,vector<bool,_std::allocator<bool>_> *bits)

{
  const_reference cVar1;
  size_type sVar2;
  byte *pbVar3;
  ulong local_50;
  size_t p;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  vector<bool,_std::allocator<bool>_> *bits_local;
  
  ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bits;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)bits);
  ::std::allocator<unsigned_char>::allocator(&local_31);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,sVar2 + 7 >> 3,
             &local_31);
  ::std::allocator<unsigned_char>::~allocator(&local_31);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)
                       ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= local_50) break;
    cVar1 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,local_50);
    pbVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                        local_50 >> 3);
    *pbVar3 = *pbVar3 | cVar1 << ((byte)local_50 & 7);
    local_50 = local_50 + 1;
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static ByteData BitsToBytes(const std::vector<bool>& bits) {
  std::vector<uint8_t> ret((bits.size() + 7) / 8);
  for (size_t p = 0; p < bits.size(); p++) {
    ret[p / 8] |= bits[p] << (p % 8);
  }
  return ByteData(ret);
}